

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O2

void vocdusave_delobj(voccxdef *ctx,objnum objn)

{
  ushort uVar1;
  objucxdef *undoctx;
  uint16_t tmp_1;
  uchar *__src;
  uchar *puVar2;
  uint16_t tmp;
  int wrdsiz;
  objucxdef *local_48;
  int wrdcnt;
  delobj_cb_ctx fnctx;
  
  undoctx = ctx->voccxundo;
  local_48 = undoctx;
  __src = mcmlck(ctx->voccxmem,objn);
  uVar1 = *(ushort *)(__src + 8);
  voc_count(ctx,objn,0,&wrdcnt,&wrdsiz);
  wrdsiz = wrdcnt * 6 + wrdsiz;
  puVar2 = objures(undoctx,'\x05',(short)wrdsiz + uVar1 + 7);
  *puVar2 = '\x03';
  *(objnum *)(puVar2 + 1) = objn;
  *(ushort *)(puVar2 + 3) = uVar1;
  *(undefined2 *)(puVar2 + 5) = (undefined2)wrdsiz;
  memcpy(puVar2 + 7,__src,(ulong)uVar1);
  fnctx.p = puVar2 + (ulong)uVar1 + 7;
  voc_iterate(ctx,objn,delobj_cb,&fnctx);
  mcmunlck(ctx->voccxmem,objn);
  local_48->objucxhead = local_48->objucxhead + uVar1 + 7 + (short)wrdsiz;
  return;
}

Assistant:

void vocdusave_delobj(voccxdef *ctx, objnum objn)
{
    objucxdef *uc = ctx->voccxundo;
    uchar     *p;
    uchar     *objp;
    uint       siz;
    int        wrdsiz;
    int        wrdcnt;
    struct delobj_cb_ctx fnctx;

    /* figure out how much we need to save */
    objp = mcmlck(ctx->voccxmem, (mcmon)objn);
    siz = objfree(objp);

    /* figure the word size */
    voc_count(ctx, objn, 0, &wrdcnt, &wrdsiz);

    /*
     *   we need to store an additional 6 bytes (2-length1, 2-length2,
     *   1-type, 1-flags) for each word 
     */
    wrdsiz += wrdcnt*6;

    /* set up the undo header */
    p = objures(uc, OBJUCLI, (ushort)(7 + siz + wrdsiz));
    *p = VOC_UNDO_DELOBJ;
    oswp2(p+1, objn);
    oswp2(p+3, siz);
    oswp2(p+5, wrdsiz);

    /* save the object's data */
    memcpy(p+7, objp, (size_t)siz);

    /* write the words */
    fnctx.p = p+7 + siz;
    voc_iterate(ctx, objn, delobj_cb, &fnctx);

    /* unlock the object and advance the undo pointer */
    mcmunlck(ctx->voccxmem, (mcmon)objn);
    uc->objucxhead += 7 + siz + wrdsiz;
}